

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ACO.h
# Opt level: O0

void __thiscall imrt::ACO::initializePheromone(ACO *this)

{
  double dVar1;
  int iVar2;
  int iVar3;
  reference this_00;
  double *pdVar4;
  long in_RDI;
  int r;
  int j;
  int i;
  int a;
  map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
  mprobability;
  map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
  mpheromone;
  int s;
  pair<int,_int> raux;
  pair<int,_int> aux;
  undefined4 in_stack_fffffffffffffe48;
  int in_stack_fffffffffffffe4c;
  Collimator *in_stack_fffffffffffffe50;
  mapped_type *in_stack_fffffffffffffe58;
  Matrix *in_stack_fffffffffffffe60;
  mapped_type *in_stack_fffffffffffffe70;
  pair<int,_int> in_stack_fffffffffffffe78;
  pair<int,_int> in_stack_fffffffffffffe88;
  map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
  *in_stack_fffffffffffffe90;
  pair<int,_int> local_f0;
  int local_e8;
  pair<int,_int> local_e4;
  int local_dc;
  int local_b8;
  int local_b4;
  int local_1c;
  pair<int,_int> local_18;
  pair<int,_int> local_10 [2];
  
  std::pair<int,_int>::pair<int,_int,_true>(local_10);
  std::pair<int,_int>::pair<int,_int,_true>(&local_18);
  local_1c = 0;
  while( true ) {
    iVar2 = local_1c;
    iVar3 = Collimator::getNbAngles(*(Collimator **)(in_RDI + 0xf8));
    if (iVar3 <= iVar2) break;
    std::
    map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>::
    map((map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
         *)0x13ed64);
    std::
    map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>::
    map((map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
         *)0x13ed71);
    Collimator::getIntensityLevelSize((Collimator *)0x13eda1);
    maths::Matrix::Matrix
              (in_stack_fffffffffffffe60,(int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
               (int)in_stack_fffffffffffffe58);
    std::vector<maths::Matrix,_std::allocator<maths::Matrix>_>::push_back
              ((vector<maths::Matrix,_std::allocator<maths::Matrix>_> *)in_stack_fffffffffffffe50,
               (value_type *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    maths::Matrix::~Matrix(in_stack_fffffffffffffe60);
    Collimator::getIntensityLevelSize((Collimator *)0x13ee1e);
    maths::Matrix::Matrix
              (in_stack_fffffffffffffe60,(int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
               (int)in_stack_fffffffffffffe58);
    std::vector<maths::Matrix,_std::allocator<maths::Matrix>_>::push_back
              ((vector<maths::Matrix,_std::allocator<maths::Matrix>_> *)in_stack_fffffffffffffe50,
               (value_type *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48));
    maths::Matrix::~Matrix(in_stack_fffffffffffffe60);
    for (local_b4 = 0; local_b4 < *(int *)(in_RDI + 0x100); local_b4 = local_b4 + 1) {
      local_b8 = 0;
      while( true ) {
        iVar2 = local_b8;
        iVar3 = Collimator::getIntensityLevelSize((Collimator *)0x13eebb);
        if (iVar3 <= iVar2) break;
        dVar1 = *(double *)(in_RDI + 0x20);
        this_00 = std::vector<maths::Matrix,_std::allocator<maths::Matrix>_>::operator[]
                            ((vector<maths::Matrix,_std::allocator<maths::Matrix>_> *)
                             (in_RDI + 0x70),(long)local_1c);
        pdVar4 = maths::Matrix::operator()(this_00,local_b4,local_b8);
        *pdVar4 = dVar1;
        local_b8 = local_b8 + 1;
      }
      Collimator::getXdim(*(Collimator **)(in_RDI + 0xf8));
      Collimator::getReferenceSize(*(Collimator **)(in_RDI + 0xf8));
      maths::Matrix::Matrix
                (in_stack_fffffffffffffe60,(int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                 (int)in_stack_fffffffffffffe58);
      std::
      map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
      ::operator[](in_stack_fffffffffffffe90,(key_type_conflict *)in_stack_fffffffffffffe88);
      maths::Matrix::operator=((Matrix *)in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
      maths::Matrix::~Matrix(in_stack_fffffffffffffe60);
      Collimator::getXdim(*(Collimator **)(in_RDI + 0xf8));
      Collimator::getReferenceSize(*(Collimator **)(in_RDI + 0xf8));
      maths::Matrix::Matrix
                (in_stack_fffffffffffffe60,(int)((ulong)in_stack_fffffffffffffe58 >> 0x20),
                 (int)in_stack_fffffffffffffe58);
      std::
      map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
      ::operator[](in_stack_fffffffffffffe90,(key_type_conflict *)in_stack_fffffffffffffe88);
      maths::Matrix::operator=((Matrix *)in_stack_fffffffffffffe78,in_stack_fffffffffffffe70);
      maths::Matrix::~Matrix(in_stack_fffffffffffffe60);
      local_dc = 0;
      while( true ) {
        iVar2 = local_dc;
        iVar3 = Collimator::getXdim(*(Collimator **)(in_RDI + 0xf8));
        if (iVar3 <= iVar2) break;
        in_stack_fffffffffffffe90 =
             *(map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
               **)(in_RDI + 0xf8);
        Collimator::getAngle(in_stack_fffffffffffffe50,in_stack_fffffffffffffe4c);
        in_stack_fffffffffffffe88 =
             Collimator::getActiveRange
                       ((Collimator *)CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),
                        0,0x13f144);
        local_e4 = in_stack_fffffffffffffe88;
        std::pair<int,_int>::operator=(local_10,&local_e4);
        local_e8 = 0;
        while( true ) {
          iVar2 = local_e8;
          iVar3 = Collimator::getReferenceSize(*(Collimator **)(in_RDI + 0xf8));
          if (iVar3 <= iVar2) break;
          in_stack_fffffffffffffe78 =
               Collimator::getReference
                         ((Collimator *)
                          CONCAT44(in_stack_fffffffffffffe4c,in_stack_fffffffffffffe48),0);
          local_f0 = in_stack_fffffffffffffe78;
          std::pair<int,_int>::operator=(&local_18,&local_f0);
          if ((local_18.first < local_10[0].first) || (local_10[0].second < local_18.second)) {
            in_stack_fffffffffffffe58 =
                 std::
                 map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                 ::operator[](in_stack_fffffffffffffe90,
                              (key_type_conflict *)in_stack_fffffffffffffe88);
            in_stack_fffffffffffffe50 =
                 (Collimator *)
                 maths::Matrix::operator()(in_stack_fffffffffffffe58,local_dc,local_e8);
            *(double *)&(in_stack_fffffffffffffe50->beam_coord)._M_t._M_impl = 0.0;
          }
          else {
            dVar1 = *(double *)(in_RDI + 0x20);
            in_stack_fffffffffffffe70 =
                 std::
                 map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
                 ::operator[](in_stack_fffffffffffffe90,
                              (key_type_conflict *)in_stack_fffffffffffffe88);
            in_stack_fffffffffffffe60 =
                 (Matrix *)maths::Matrix::operator()(in_stack_fffffffffffffe70,local_dc,local_e8);
            *(double *)in_stack_fffffffffffffe60 = dVar1;
          }
          local_e8 = local_e8 + 1;
        }
        local_dc = local_dc + 1;
      }
    }
    std::
    vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
    ::push_back((vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
                 *)in_stack_fffffffffffffe60,(value_type *)in_stack_fffffffffffffe58);
    std::
    vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
    ::push_back((vector<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>,_std::allocator<std::map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>_>_>
                 *)in_stack_fffffffffffffe60,(value_type *)in_stack_fffffffffffffe58);
    std::
    map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>::
    ~map((map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
          *)0x13f399);
    std::
    map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>::
    ~map((map<int,_maths::Matrix,_std::less<int>,_std::allocator<std::pair<const_int,_maths::Matrix>_>_>
          *)0x13f3a6);
    local_1c = local_1c + 1;
  }
  return;
}

Assistant:

void initializePheromone () {
    pair <int,int> aux, raux;
    for (int s = 0; s < collimator.getNbAngles(); s++) {
      map<int, Matrix> mpheromone;
      map<int, Matrix> mprobability;
      ipheromone.push_back(Matrix(max_apertures,  collimator.getIntensityLevelSize()));
      iprobability.push_back(Matrix(max_apertures,  collimator.getIntensityLevelSize()));
      for (int a=0; a< max_apertures; a++) {
        // Intensity initial pheromones
        for (int i=0; i< collimator.getIntensityLevelSize(); i++){
          ipheromone[s](a,i) = initial_pheromone;
        }
        // Aperture initial pheromones
        mpheromone[a] = Matrix(collimator.getXdim(), collimator.getReferenceSize());
        mprobability[a] = Matrix(collimator.getXdim(), collimator.getReferenceSize());
        for (int j = 0; j < collimator.getXdim(); j++) {
          aux = collimator.getActiveRange(j, collimator.getAngle(s));
          for (int r = 0; r < collimator.getReferenceSize(); r++) {
            raux = collimator.getReference(r);
            if (raux.first >= aux.first &&
                raux.second <= aux.second) {
               mpheromone[a](j,r) = initial_pheromone;
            } else {
               mpheromone[a](j,r) = 0;
            }
          }
        }
      }
      pheromone.push_back(mpheromone);
      probability.push_back(mprobability);
    }
  }